

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

type * check_declarator(c2m_ctx_t c2m_ctx,node_t_conflict r,int func_def_p)

{
  uchar uVar1;
  node_code_t nVar2;
  check_ctx *pcVar3;
  byte *pbVar4;
  int iVar5;
  node_t_conflict pnVar6;
  type *el;
  arr_type *paVar7;
  node_t_conflict pnVar8;
  decl_spec *pdVar9;
  type *head;
  node_t pnVar10;
  node_t node;
  bool bVar11;
  pos_t pVar12;
  
  pcVar3 = c2m_ctx->check_ctx;
  pnVar6 = DLIST_node_t_el(&(r->u).ops,1);
  if (r->code != N_DECL) {
    __assert_fail("r->code == N_DECL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1b49,"struct type *check_declarator(c2m_ctx_t, node_t, int)");
  }
  node = (pnVar6->u).ops.head;
  head = (type *)0x0;
  if (node != (node_t)0x0) {
    for (; node != (node_t_conflict)0x0; node = (node->op_link).next) {
      el = create_type(c2m_ctx,(type *)0x0);
      el->pos_node = node;
      nVar2 = node->code;
      if (nVar2 == N_FUNC) {
        pnVar10 = (node->u).ops.head;
        pnVar6 = (pnVar10->u).ops.tail;
        uVar1 = pcVar3->in_params_p;
        el->mode = TM_FUNC;
        el->pos_node = node;
        pnVar8 = (node_t_conflict)reg_malloc(c2m_ctx,0x20);
        (el->u).tag_type = pnVar8;
        pnVar8->attr = (void *)0x0;
        (pnVar8->op_link).next = (node_t)0x0;
        if (pnVar6 == (node_t_conflict)0x0) {
          bVar11 = false;
        }
        else {
          bVar11 = pnVar6->code == N_DOTS;
        }
        *(undefined1 *)&pnVar8->code = (char)pnVar8->code & (N_ATTR|N_MODULE) | bVar11;
        if (bVar11 != false) {
          DLIST_node_t_remove(&(pnVar10->u).ops,pnVar6);
        }
        if (func_def_p == 0) {
          create_node_scope(c2m_ctx,node);
        }
        (pnVar8->op_link).prev = pnVar10;
        pcVar3->in_params_p = '\x01';
        pnVar6 = (pnVar10->u).ops.head;
        if ((pnVar6 != (node_t_conflict)0x0) && (pnVar6->code != N_ID)) {
          check(c2m_ctx,pnVar6,node);
        }
        iVar5 = void_param_p(pnVar6);
        pnVar10 = pnVar6;
        if (iVar5 == 0) {
          for (; pnVar10 != (node_t_conflict)0x0; pnVar10 = (pnVar10->op_link).next) {
            if (pnVar10->code == N_ID) {
              if (func_def_p == 0) {
                pVar12 = get_node_pos(c2m_ctx,pnVar10);
                error(c2m_ctx,0x18d261,pVar12.fname,pVar12._8_8_);
                pcVar3->in_params_p = uVar1;
                goto LAB_00158cd9;
              }
              pcVar3->in_params_p = uVar1;
              goto LAB_00158d40;
            }
            if (pnVar10 != pnVar6) {
              check(c2m_ctx,pnVar10,node);
            }
            pdVar9 = get_param_decl_spec(pnVar10);
            adjust_param_type(c2m_ctx,&pdVar9->type);
          }
        }
        else {
          pbVar4 = (byte *)pnVar6->attr;
          if (((((*pbVar4 & 0xef) != 0) || (*pbVar4 != 0)) || (*(long *)(pbVar4 + 8) != 0)) ||
             ((*(byte *)(*(long *)(pbVar4 + 0x18) + 0x14) & 0xf) != 0)) {
            pVar12 = get_node_pos(c2m_ctx,pnVar6);
            error(c2m_ctx,0x18d228,pVar12.fname,pVar12._8_8_);
          }
          if ((pnVar6->op_link).next != (node_t)0x0) {
            pVar12 = get_node_pos(c2m_ctx,pnVar6);
            error(c2m_ctx,0x18d241,pVar12.fname,pVar12._8_8_);
          }
        }
        pcVar3->in_params_p = uVar1;
        if (func_def_p == 0) {
LAB_00158cd9:
          c2m_ctx->check_ctx->curr_scope =
               *(node_t_conflict *)((long)c2m_ctx->check_ctx->curr_scope->attr + 0x20);
        }
      }
      else if (nVar2 == N_ARR) {
        pnVar10 = (node->u).ops.head;
        pnVar6 = (pnVar10->op_link).next;
        pnVar8 = (pnVar6->op_link).next;
        el->mode = TM_ARR;
        el->pos_node = node;
        paVar7 = (arr_type *)reg_malloc(c2m_ctx,0x20);
        (el->u).arr_type = paVar7;
        *(byte *)&paVar7->ind_type_qual = *(byte *)&paVar7->ind_type_qual & 0xf0;
        set_type_qual(c2m_ctx,pnVar6,&paVar7->ind_type_qual,TM_UNDEF);
        check(c2m_ctx,pnVar8,node);
        paVar7->size = pnVar8;
        *(byte *)paVar7 = *(byte *)paVar7 & 0xfe | pnVar10->code == N_STATIC;
        paVar7->el_type = (type *)0x0;
      }
      else {
        if (nVar2 != N_POINTER) {
          abort();
        }
        pnVar6 = (node->u).ops.head;
        el->mode = TM_PTR;
        el->pos_node = node;
        (el->u).tag_type = (node_t_conflict)0x0;
        set_type_qual(c2m_ctx,pnVar6,&el->type_qual,TM_PTR);
      }
LAB_00158d40:
      head = append_type(head,el);
    }
  }
  return head;
}

Assistant:

static struct type *check_declarator (c2m_ctx_t c2m_ctx, node_t r, int func_def_p) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;
  struct type *type, *res = NULL;
  node_t list = NL_EL (r->u.ops, 1);

  assert (r->code == N_DECL);
  if (NL_HEAD (list->u.ops) == NULL) return NULL;
  for (node_t n = NL_HEAD (list->u.ops); n != NULL; n = NL_NEXT (n)) {
    type = create_type (c2m_ctx, NULL);
    type->pos_node = n;
    switch (n->code) {
    case N_POINTER: {
      node_t type_qual = NL_HEAD (n->u.ops);

      type->mode = TM_PTR;
      type->pos_node = n;
      type->u.ptr_type = NULL;
      set_type_qual (c2m_ctx, type_qual, &type->type_qual, TM_PTR);
      break;
    }
    case N_ARR: {
      struct arr_type *arr_type;
      node_t static_node = NL_HEAD (n->u.ops);
      node_t type_qual = NL_NEXT (static_node);
      node_t size = NL_NEXT (type_qual);

      type->mode = TM_ARR;
      type->pos_node = n;
      type->u.arr_type = arr_type = reg_malloc (c2m_ctx, sizeof (struct arr_type));
      clear_type_qual (&arr_type->ind_type_qual);
      set_type_qual (c2m_ctx, type_qual, &arr_type->ind_type_qual, TM_UNDEF);
      check (c2m_ctx, size, n);
      arr_type->size = size;
      arr_type->static_p = static_node->code == N_STATIC;
      arr_type->el_type = NULL;
      break;
    }
    case N_FUNC: {
      struct func_type *func_type;
      node_t first_param, param_list = NL_HEAD (n->u.ops);
      node_t last = NL_TAIL (param_list->u.ops);
      int saved_in_params_p = in_params_p;

      type->mode = TM_FUNC;
      type->pos_node = n;
      type->u.func_type = func_type = reg_malloc (c2m_ctx, sizeof (struct func_type));
      func_type->ret_type = NULL;
      func_type->proto_item = NULL;
      if ((func_type->dots_p = last != NULL && last->code == N_DOTS))
        NL_REMOVE (param_list->u.ops, last);
      if (!func_def_p) create_node_scope (c2m_ctx, n);
      func_type->param_list = param_list;
      in_params_p = TRUE;
      first_param = NL_HEAD (param_list->u.ops);
      if (first_param != NULL && first_param->code != N_ID) check (c2m_ctx, first_param, n);
      if (void_param_p (first_param)) {
        struct decl_spec *ds = first_param->attr;

        if (non_reg_decl_spec_p (ds) || ds->register_p
            || !type_qual_eq_p (&ds->type->type_qual, &zero_type_qual)) {
          error (c2m_ctx, POS (first_param), "qualified void parameter");
        }
        if (NL_NEXT (first_param) != NULL) {
          error (c2m_ctx, POS (first_param), "void must be the only parameter");
        }
      } else {
        for (node_t p = first_param; p != NULL; p = NL_NEXT (p)) {
          struct decl_spec *decl_spec_ptr;

          if (p->code == N_ID) {
            if (!func_def_p)
              error (c2m_ctx, POS (p),
                     "parameters identifier list can be only in function definition");
            break;
          } else {
            if (p != first_param) check (c2m_ctx, p, n);
            decl_spec_ptr = get_param_decl_spec (p);
            adjust_param_type (c2m_ctx, &decl_spec_ptr->type);
          }
        }
      }
      in_params_p = saved_in_params_p;
      if (!func_def_p) finish_scope (c2m_ctx);
      break;
    }
    default: abort ();
    }
    res = append_type (res, type);
  }
  return res;
}